

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::add_file_to_generate
          (CodeGeneratorRequest *this,string *value)

{
  int iVar1;
  Rep *pRVar2;
  ArenaImpl *this_00;
  string *psVar3;
  
  pRVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_002285ee:
    internal::RepeatedPtrFieldBase::Reserve
              (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
               (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      psVar3 = (string *)pRVar2->elements[iVar1];
      goto LAB_0022865d;
    }
    if (pRVar2->allocated_size == (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_002285ee;
  }
  pRVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (ArenaImpl *)(this->file_to_generate_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (ArenaImpl *)0x0) {
    psVar3 = (string *)operator_new(0x20);
  }
  else {
    if (this_00[1].initial_block_ != (Block *)0x0) {
      Arena::OnArenaAllocation((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    psVar3 = (string *)
             internal::ArenaImpl::AllocateAlignedAndAddCleanup
                       (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>);
  }
  *(string **)psVar3 = psVar3 + 0x10;
  *(long *)(psVar3 + 8) = 0;
  psVar3[0x10] = (string)0x0;
  pRVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = psVar3;
LAB_0022865d:
  std::__cxx11::string::_M_assign(psVar3);
  return;
}

Assistant:

inline void CodeGeneratorRequest::add_file_to_generate(const std::string& value) {
  file_to_generate_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:google.protobuf.compiler.CodeGeneratorRequest.file_to_generate)
}